

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O1

Var Js::Math::Min(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  Var pvVar7;
  uint uVar8;
  ulong uVar9;
  uint idxArg;
  int in_stack_00000010;
  CallInfo local_60;
  CallInfo callInfo_local;
  CallInfo local_48;
  undefined1 local_40 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_60._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x312,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d42235;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_40 = (undefined1  [8])local_60;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_40,&local_60);
  if (((ulong)local_40 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x313,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00d42235;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x317,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d42235;
    *puVar5 = 0;
  }
  uVar8 = local_40._0_4_ & 0xffffff;
  if (uVar8 < 2) {
    return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           positiveInfinite.ptr;
  }
  if (uVar8 == 2) {
    pvVar6 = Arguments::operator[]((Arguments *)local_40,1);
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d42235;
      *puVar5 = 0;
    }
    if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      local_48 = (CallInfo)(double)(int)pvVar6;
    }
    else if ((ulong)pvVar6 >> 0x32 == 0) {
      local_48 = (CallInfo)JavascriptConversion::ToNumber_Full(pvVar6,pSVar1);
    }
    else {
      local_48 = (CallInfo)((ulong)pvVar6 ^ 0xfffc000000000000);
    }
  }
  else {
    bVar3 = ((ulong)local_40 & 0xfffffe) == 0;
    if (!bVar3) {
      uVar8 = 1;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      bVar3 = false;
      do {
        pvVar6 = Arguments::operator[]((Arguments *)local_40,uVar8);
        if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar4) goto LAB_00d42235;
          *puVar5 = 0;
        }
        if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) break;
        uVar8 = uVar8 + 1;
        bVar4 = uVar8 < (local_40._0_4_ & 0xffffff);
        bVar3 = !bVar4;
      } while (bVar4);
    }
    if (bVar3) {
      if ((local_40._0_4_ & 0xffffff) == 3) {
        pvVar6 = Arguments::operator[]((Arguments *)local_40,1);
        if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_00d42235;
          *puVar5 = 0;
        }
        if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'")
          ;
          if (!bVar3) goto LAB_00d42235;
          *puVar5 = 0;
        }
        pvVar7 = Arguments::operator[]((Arguments *)local_40,2);
        if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_00d42235;
          *puVar5 = 0;
        }
        if (((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'")
          ;
          if (!bVar3) goto LAB_00d42235;
          *puVar5 = 0;
        }
        if ((int)pvVar6 < (int)pvVar7) {
          pvVar7 = pvVar6;
        }
        uVar9 = (ulong)pvVar7 & 0xffffffff;
LAB_00d42216:
        return (Var)(uVar9 | 0x1000000000000);
      }
      if (bVar3) {
        pvVar6 = Arguments::operator[]((Arguments *)local_40,1);
        if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_00d42235;
          *puVar5 = 0;
        }
        if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'")
          ;
          if (!bVar3) goto LAB_00d42235;
          *puVar5 = 0;
        }
        if ((local_40._0_4_ & 0xffffff) < 3) {
          uVar8 = (uint)pvVar6;
        }
        else {
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          idxArg = 2;
          do {
            pvVar7 = Arguments::operator[]((Arguments *)local_40,idxArg);
            if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000 &&
                ((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar5 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar3) goto LAB_00d42235;
              *puVar5 = 0;
            }
            if (((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar5 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x43,"(Is(aValue))",
                                          "Ensure var is actually a \'TaggedInt\'");
              if (!bVar3) goto LAB_00d42235;
              *puVar5 = 0;
            }
            if ((int)pvVar6 < (int)pvVar7) {
              pvVar7 = pvVar6;
            }
            uVar8 = (uint)pvVar7;
            idxArg = idxArg + 1;
            pvVar6 = (Var)((ulong)pvVar7 & 0xffffffff);
          } while (idxArg < (local_40._0_4_ & 0xffffff));
        }
        uVar9 = (ulong)uVar8;
        goto LAB_00d42216;
      }
    }
    pvVar6 = Arguments::operator[]((Arguments *)local_40,1);
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00d42235:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      local_48 = (CallInfo)(double)(int)pvVar6;
    }
    else if ((ulong)pvVar6 >> 0x32 == 0) {
      local_48 = (CallInfo)JavascriptConversion::ToNumber_Full(pvVar6,pSVar1);
    }
    else {
      local_48 = (CallInfo)((ulong)pvVar6 ^ 0xfffc000000000000);
    }
    bVar3 = NumberUtilities::IsNan((double)local_48);
    if (2 < (local_40._0_4_ & 0xffffff)) {
      uVar8 = 2;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pvVar6 = Arguments::operator[]((Arguments *)local_40,uVar8);
        if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar4) goto LAB_00d42235;
          *puVar5 = 0;
        }
        if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
          callInfo_local = (CallInfo)(double)(int)pvVar6;
        }
        else if (pvVar6 < (Var)0x4000000000000) {
          callInfo_local = (CallInfo)JavascriptConversion::ToNumber_Full(pvVar6,pSVar1);
        }
        else {
          callInfo_local = (CallInfo)((ulong)pvVar6 ^ 0xfffc000000000000);
        }
        bVar4 = NumberUtilities::IsNan((double)callInfo_local);
        if (bVar4) {
          bVar3 = true;
        }
        else if (bVar3 == false) {
          if (((((double)local_48 == 0.0) && (!NAN((double)local_48))) &&
              (bVar4 = NumberUtilities::IsSpecial((double)callInfo_local,0x8000000000000000), bVar4)
              ) || ((double)callInfo_local < (double)local_48)) {
            local_48 = callInfo_local;
          }
        }
        else {
          bVar3 = true;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (local_40._0_4_ & 0xffffff));
    }
    if (bVar3 != false) {
      return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             nan.ptr;
    }
  }
  pvVar6 = JavascriptNumber::ToVarNoCheck((double)local_48,pSVar1);
  return pvVar6;
}

Assistant:

Var Math::Min(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();
        bool hasOnlyIntegerArgs = false;

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count <= 1)
        {
            return scriptContext->GetLibrary()->GetPositiveInfinite();
        }
        else if (args.Info.Count == 2)
        {
            double result = JavascriptConversion::ToNumber(args[1], scriptContext);
            return JavascriptNumber::ToVarNoCheck(result, scriptContext);
        }
        else
        {
            hasOnlyIntegerArgs = TaggedInt::OnlyContainsTaggedInt(args);
            if (hasOnlyIntegerArgs && args.Info.Count == 3)
            {
                return TaggedInt::ToVarUnchecked(min(TaggedInt::ToInt32(args[1]), TaggedInt::ToInt32(args[2])));
            }
        }

        if (hasOnlyIntegerArgs)
        {
            int32 current = TaggedInt::ToInt32(args[1]);
            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                int32 compare = TaggedInt::ToInt32(args[idxArg]);
                if (current > compare)
                {
                    current = compare;
                }
            }

            return TaggedInt::ToVarUnchecked(current);
        }
        else
        {
            double current = JavascriptConversion::ToNumber(args[1], scriptContext);

            bool returnNaN = false;
            if (JavascriptNumber::IsNan(current))
            {
                returnNaN = true;
            }

            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                double compare = JavascriptConversion::ToNumber(args[idxArg], scriptContext);
                if (JavascriptNumber::IsNan(compare) || returnNaN) // Call ToNumber for all args
                {
                    returnNaN = true;
                }

                // In C++, -0.0f == 0.0f; however, in ES, -0.0f < 0.0f. Thus, use additional library 
                // call to test this comparison.
                else if ((current == 0 && JavascriptNumber::IsNegZero(compare)) ||
                    current > compare)
                {
                    current = compare;
                }
            }

            if (returnNaN)
            {
                return scriptContext->GetLibrary()->GetNaN();
            }

            return JavascriptNumber::ToVarNoCheck(current, scriptContext);
        }
    }